

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdtFunc.h
# Opt level: O0

void SDT::ERROR(int line,string *sgn)

{
  string local_258 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218 [32];
  string local_1f8 [8];
  string o;
  allocator local_1c1;
  string local_1c0 [32];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  string *local_18;
  string *sgn_local;
  int line_local;
  
  local_18 = sgn;
  sgn_local._4_4_ = line;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,"",&local_1c1);
  std::__cxx11::stringstream::str((string *)local_1a0);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::ostream::operator<<(local_190,sgn_local._4_4_);
  std::__cxx11::string::string(local_1f8);
  std::operator>>((istream *)local_1a0,local_1f8);
  std::operator+((char *)local_258,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Error at Line ");
  std::operator+(local_238,(char *)local_258);
  std::operator+(local_218,local_238);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)errVec_abi_cxx11_,local_218);
  std::__cxx11::string::~string((string *)local_218);
  std::__cxx11::string::~string((string *)local_238);
  std::__cxx11::string::~string(local_258);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void ERROR(int line,string sgn){
        stringstream ss;
        ss.str("");
        ss << line;
        string o;
        ss >> o;
        errVec.push_back("Error at Line "+ o +": " + sgn);
    }